

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O1

void __thiscall QTableModel::setItem(QTableModel *this,int row,int column,QTableWidgetItem *item)

{
  QTableWidgetItem **ppQVar1;
  QTableWidgetItem *pQVar2;
  bool bVar3;
  int iVar4;
  SortOrder order;
  QTableView *this_00;
  pointer ppQVar5;
  QHeaderView *pQVar6;
  iterator iVar7;
  iterator iVar8;
  ulong uVar9;
  longlong lVar10;
  uint uVar11;
  int iVar12;
  long in_FS_OFFSET;
  iterator local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  iterator local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  QArrayData *local_58;
  QTableWidgetItem **ppQStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar11 = column + (int)(this->horizontalHeaderItems).d.size * row;
  if (((int)uVar11 < 0) ||
     (uVar9 = (ulong)(uVar11 & 0x7fffffff), (ulong)(this->tableItems).d.size <= uVar9))
  goto LAB_0059d3da;
  ppQVar1 = (this->tableItems).d.ptr;
  pQVar2 = ppQVar1[uVar9];
  if (pQVar2 == item) goto LAB_0059d3da;
  if (pQVar2 != (QTableWidgetItem *)0x0) {
    pQVar2->view = (QTableWidget *)0x0;
  }
  pQVar2 = ppQVar1[uVar9];
  if (pQVar2 != (QTableWidgetItem *)0x0) {
    (*pQVar2->_vptr_QTableWidgetItem[1])();
  }
  this_00 = (QTableView *)QMetaObject::cast((QObject *)&QTableWidget::staticMetaObject);
  if (item != (QTableWidgetItem *)0x0) {
    item->d->id = uVar11;
  }
  ppQVar5 = QList<QTableWidgetItem_*>::data(&this->tableItems);
  ppQVar5[uVar9] = item;
  if ((this_00 == (QTableView *)0x0) || (bVar3 = QTableView::isSortingEnabled(this_00), !bVar3)) {
LAB_0059d353:
    local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    ppQStack_50 = (QTableWidgetItem **)&DAT_aaaaaaaaaaaaaaaa;
    local_78.i = (QTableWidgetItem **)0xffffffffffffffff;
    uStack_70 = 0;
    uStack_68 = 0;
    QAbstractTableModel::index
              ((int)(QModelIndex *)&local_58,(int)this,(QModelIndex *)(ulong)(uint)row);
    local_78.i = (QTableWidgetItem **)0x0;
    uStack_70 = 0;
    uStack_68 = 0;
    QAbstractItemModel::dataChanged
              ((QModelIndex *)this,(QModelIndex *)&local_58,(QList_conflict *)&local_58);
    if ((QArrayData *)local_78.i == (QArrayData *)0x0) goto LAB_0059d3da;
    LOCK();
    *(int *)local_78.i = *(int *)local_78.i + -1;
    UNLOCK();
    if (*(int *)local_78.i != 0) goto LAB_0059d3da;
    lVar10 = 4;
    iVar7.i = local_78.i;
  }
  else {
    pQVar6 = QTableView::horizontalHeader(this_00);
    iVar4 = QHeaderView::sortIndicatorSection(pQVar6);
    if (iVar4 != column) goto LAB_0059d353;
    pQVar6 = QTableView::horizontalHeader(this_00);
    order = QHeaderView::sortIndicatorOrder(pQVar6);
    local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    ppQStack_50 = (QTableWidgetItem **)&DAT_aaaaaaaaaaaaaaaa;
    columnItems((QList<QTableWidgetItem_*> *)&local_58,this,column);
    if ((long)row < (long)local_48.ptr) {
      QList<QTableWidgetItem_*>::remove((QList<QTableWidgetItem_*> *)&local_58,(char *)(long)row);
    }
    if (item == (QTableWidgetItem *)0x0) {
      iVar4 = (int)local_48.ptr;
    }
    else {
      local_78 = QList<QTableWidgetItem_*>::begin((QList<QTableWidgetItem_*> *)&local_58);
      local_90 = QList<QTableWidgetItem_*>::end((QList<QTableWidgetItem_*> *)&local_58);
      iVar7 = sortedInsertionIterator(&local_78,&local_90,order,item);
      iVar8 = QList<QTableWidgetItem_*>::begin((QList<QTableWidgetItem_*> *)&local_58);
      iVar12 = (int)((ulong)((long)iVar7.i - (long)iVar8.i) >> 3);
      iVar4 = 0;
      if (0 < iVar12) {
        iVar4 = iVar12;
      }
    }
    if (iVar4 == row) {
      if (local_58 != (QArrayData *)0x0) {
        LOCK();
        (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_58,8,0x10);
        }
      }
      goto LAB_0059d353;
    }
    local_78.i = (QTableWidgetItem **)0xffffffffffffffff;
    uStack_70 = 0;
    uStack_68 = 0;
    local_90.i = (QTableWidgetItem **)0xffffffffffffffff;
    local_88 = 0;
    uStack_80 = 0;
    (**(code **)(*(long *)this + 0x118))(this,&local_78,row,1,&local_90,iVar4 + (uint)(row < iVar4))
    ;
    if (local_58 == (QArrayData *)0x0) goto LAB_0059d3da;
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i != 0) goto LAB_0059d3da;
    lVar10 = 8;
    iVar7.i = (QTableWidgetItem **)local_58;
  }
  QArrayData::deallocate((QArrayData *)iVar7.i,lVar10,0x10);
LAB_0059d3da:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableModel::setItem(int row, int column, QTableWidgetItem *item)
{
    int i = tableIndex(row, column);
    if (i < 0 || i >= tableItems.size())
        return;
    QTableWidgetItem *oldItem = tableItems.at(i);
    if (item == oldItem)
        return;

    // remove old
    if (oldItem)
        oldItem->view = nullptr;
    delete tableItems.at(i);

    QTableWidget *view = this->view();

    // set new
    if (item)
        item->d->id = i;
    tableItems[i] = item;

    if (view && view->isSortingEnabled()
        && view->horizontalHeader()->sortIndicatorSection() == column) {
        // sorted insertion
        Qt::SortOrder order = view->horizontalHeader()->sortIndicatorOrder();
        QList<QTableWidgetItem *> colItems = columnItems(column);
        if (row < colItems.size())
            colItems.remove(row);
        int sortedRow;
        if (item == nullptr) {
            // move to after all non-0 (sortable) items
            sortedRow = colItems.size();
        } else {
            QList<QTableWidgetItem *>::iterator it;
            it = sortedInsertionIterator(colItems.begin(), colItems.end(), order, item);
            sortedRow = qMax((int)(it - colItems.begin()), 0);
        }
        if (sortedRow != row) {
            const int destinationChild = sortedRow > row ? sortedRow + 1 : sortedRow;
            moveRows(QModelIndex(), row, 1, QModelIndex(), destinationChild);
            return;
        }
    }
    QModelIndex idx = QAbstractTableModel::index(row, column);
    emit dataChanged(idx, idx);
}